

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O0

uint32_t *
FastPForLib::SIMDFastPFor<4u>::
unpackmesimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
          (uint32_t *in,
          vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *out,
          uint32_t bit)

{
  int iVar1;
  size_type sVar2;
  undefined1 *__new_size;
  uint in_EDX;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *in_RSI;
  uint *in_RDI;
  uint32_t *bpointer;
  uint32_t remaining;
  uint32_t buffer [32];
  uint32_t j;
  uint32_t size;
  undefined8 in_stack_ffffffffffffff30;
  uint32_t *in_stack_ffffffffffffff38;
  uint32_t *in_stack_ffffffffffffff40;
  uint32_t *in_stack_ffffffffffffff48;
  undefined1 *puVar3;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined1 local_a8 [140];
  uint local_1c;
  uint local_18;
  uint local_14;
  vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *local_10;
  uint32_t *local_8;
  
  local_18 = *in_RDI;
  local_8 = in_RDI + 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::resize
            ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (size_type)in_stack_ffffffffffffff48);
  for (local_1c = 0; local_1c + 0x80 <= local_18; local_1c = local_1c + 0x80) {
    in_stack_ffffffffffffff40 = local_8;
    std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::operator[]
              (local_10,(ulong)local_1c);
    usimdunpack((__m128i *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                in_stack_ffffffffffffff48,(uint32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    local_8 = local_8 + (local_14 << 2);
  }
  for (; local_1c + 0x1f < local_18; local_1c = local_1c + 0x20) {
    in_stack_ffffffffffffff38 = local_8;
    std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::operator[]
              (local_10,(ulong)local_1c);
    fastunpack(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    local_8 = local_8 + local_14;
  }
  iVar1 = local_18 - local_1c;
  memcpy(local_a8,local_8,(ulong)(iVar1 * local_14 + 0x1f >> 5) << 2);
  __new_size = local_a8;
  sVar2 = std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::size
                    (local_10);
  local_8 = local_8 + (sVar2 - local_1c >> 5) * (ulong)local_14;
  for (; local_1c < local_18; local_1c = local_1c + 0x20) {
    puVar3 = __new_size;
    std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::operator[]
              (local_10,(ulong)local_1c);
    fastunpack(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (uint32_t)((ulong)__new_size >> 0x20));
    __new_size = puVar3 + (ulong)local_14 * 4;
  }
  local_8 = local_8 + -(ulong)((local_1c - local_18) * local_14 >> 5);
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::resize
            ((vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff50),(size_type)__new_size);
  return local_8;
}

Assistant:

static const uint32_t *unpackmesimd(const uint32_t *in, STLContainer &out,
                                      const uint32_t bit) {
    const uint32_t size = *in;
    ++in;
    out.resize((size + 32 - 1) / 32 * 32);
    uint32_t j = 0;
    for (; j + 128 <= size; j += 128) {
      usimdunpack(reinterpret_cast<const __m128i *>(in), &out[j], bit);
      in += 4 * bit;
    }
    for (; j + 31 < size; j += 32) {
      fastunpack(in, &out[j], bit);
      in += bit;
    }
    uint32_t buffer[PACKSIZE];
    uint32_t remaining = size - j;
    memcpy(buffer, in, (remaining * bit + 31) / 32 * sizeof(uint32_t));
    uint32_t *bpointer = buffer;
    in += (out.size() - j) / 32 * bit;
    for (; j < size; j += 32) {
      fastunpack(bpointer, &out[j], bit);
      bpointer += bit;
    }
    in -= (j - size) * bit / 32;
    out.resize(size);
    return in;
  }